

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O0

TimeData *
helics::generateMinTimeUpstream
          (TimeDependencies *dependencies,bool restricted,GlobalFederateId self,
          GlobalFederateId ignore,int32_t responseCode)

{
  bool bVar1;
  const_iterator cVar2;
  reference mTime_00;
  BaseType in_ECX;
  byte in_DL;
  undefined8 in_RSI;
  TimeData *in_RDI;
  undefined4 in_R8D;
  TimeData *mTime;
  DependencyInfo *dep;
  const_iterator __end1;
  const_iterator __begin1;
  TimeDependencies *__range1;
  int32_t iterationCount;
  TimeDependencies *in_stack_ffffffffffffff98;
  TimeData *rhs;
  undefined2 in_stack_ffffffffffffffb4;
  uint8_t in_stack_ffffffffffffffb6;
  TimeState in_stack_ffffffffffffffb7;
  TimeData *in_stack_ffffffffffffffb8;
  Time in_stack_ffffffffffffffc0;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  local_38;
  undefined8 local_30;
  int local_24;
  baseType local_20;
  byte local_11;
  undefined8 local_10;
  undefined4 local_8;
  GlobalFederateId local_4;
  
  local_11 = in_DL & 1;
  rhs = in_RDI;
  local_10 = in_RSI;
  local_8 = in_R8D;
  local_4.gid = in_ECX;
  local_20 = (baseType)TimeRepresentation<count_time<9,_long>_>::maxVal();
  TimeData::TimeData(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb7,
                     in_stack_ffffffffffffffb6);
  local_24 = 0;
  local_30 = local_10;
  local_38._M_current = (DependencyInfo *)TimeDependencies::begin(in_stack_ffffffffffffff98);
  cVar2 = TimeDependencies::end(in_stack_ffffffffffffff98);
  do {
    bVar1 = __gnu_cxx::
            operator==<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                      ((__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                        *)in_RDI,
                       (__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                        *)in_stack_ffffffffffffff98);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<(&rhs->Te,&rhs->minDe);
      if (bVar1) {
        (rhs->minDe).internalTimeCode = (rhs->Te).internalTimeCode;
      }
      if (((local_11 & 1) == 0) &&
         (bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>(&rhs->minDe,&rhs->next), bVar1
         )) {
        (rhs->next).internalTimeCode = (rhs->minDe).internalTimeCode;
      }
      rhs->sequenceCounter = local_24;
      if (rhs->mTimeState < time_granted) {
        (rhs->next).internalTimeCode = -1;
        (rhs->minDe).internalTimeCode = -1;
        (rhs->Te).internalTimeCode = -1;
      }
      return in_RDI;
    }
    mTime_00 = __gnu_cxx::
               __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
               ::operator*(&local_38);
    if (((mTime_00->dependency & 1U) != 0) && (mTime_00->connection != PARENT)) {
      bVar1 = GlobalFederateId::isValid(&local_4);
      if (bVar1) {
        in_stack_ffffffffffffffb4 = (undefined2)local_4.gid;
        in_stack_ffffffffffffffb6 = (uint8_t)((uint)local_4.gid >> 0x10);
        in_stack_ffffffffffffffb7 = (TimeState)((uint)local_4.gid >> 0x18);
        bVar1 = GlobalFederateId::operator==(&(mTime_00->super_TimeData).minFedActual,local_4);
        if (bVar1) goto LAB_0062732d;
      }
      local_24 = (mTime_00->super_TimeData).sequenceCounter + local_24;
      generateMinTimeImplementation
                (&mTime_00->super_TimeData,
                 (DependencyInfo *)
                 CONCAT17(in_stack_ffffffffffffffb7,
                          CONCAT16(in_stack_ffffffffffffffb6,
                                   CONCAT24(in_stack_ffffffffffffffb4,local_8))),
                 (GlobalFederateId)(BaseType)((ulong)cVar2._M_current >> 0x20),
                 (int32_t)((ulong)rhs >> 0x20));
    }
LAB_0062732d:
    __gnu_cxx::
    __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
    ::operator++(&local_38);
  } while( true );
}

Assistant:

TimeData generateMinTimeUpstream(const TimeDependencies& dependencies,
                                 bool restricted,
                                 GlobalFederateId self,
                                 GlobalFederateId ignore,
                                 std::int32_t responseCode)
{
    TimeData mTime(Time::maxVal(), TimeState::error);
    std::int32_t iterationCount{0};
    for (const auto& dep : dependencies) {
        if (!dep.dependency) {
            continue;
        }
        if (dep.connection == ConnectionType::PARENT) {
            continue;
        }
        if (self.isValid() && dep.minFedActual == self) {
            continue;
        }
        iterationCount += dep.sequenceCounter;
        generateMinTimeImplementation(mTime, dep, ignore, responseCode);
    }
    if (mTime.Te < mTime.minDe) {
        mTime.minDe = mTime.Te;
    }

    if (!restricted) {
        if (mTime.minDe > mTime.next) {
            mTime.next = mTime.minDe;
        }
    }
    mTime.sequenceCounter = iterationCount;
    if (mTime.mTimeState < TimeState::time_granted) {
        mTime.next = initializationTime;
        mTime.minDe = initializationTime;
        mTime.Te = initializationTime;
    }
    return mTime;
}